

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsPointerToArrayType(CopyPropagateArrays *this,uint32_t type_id)

{
  bool bVar1;
  int iVar2;
  TypeManager *this_00;
  Type *pTVar3;
  undefined4 extraout_var;
  
  this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  pTVar3 = analysis::TypeManager::GetType(this_00,type_id);
  iVar2 = (*pTVar3->_vptr_Type[0x1f])(pTVar3);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = *(int *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x28) + 0x20);
    bVar1 = iVar2 == 6 || iVar2 == 9;
  }
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::IsPointerToArrayType(uint32_t type_id) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Pointer* pointer_type = type_mgr->GetType(type_id)->AsPointer();
  if (pointer_type) {
    return pointer_type->pointee_type()->kind() == analysis::Type::kArray ||
           pointer_type->pointee_type()->kind() == analysis::Type::kImage;
  }
  return false;
}